

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O2

int __thiscall TokenPipeEnd::TokenWrite(TokenPipeEnd *this,uint8_t token)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  long in_FS_OFFSET;
  uint8_t token_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = -1;
  token_local = token;
  do {
    sVar1 = ::write(this->m_fd,&token_local,1);
    if (-1 < sVar1) {
      iVar3 = (uint)(sVar1 != 0) * 2 + -2;
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int TokenPipeEnd::TokenWrite(uint8_t token)
{
    while (true) {
        ssize_t result = write(m_fd, &token, 1);
        if (result < 0) {
            // Failure. It's possible that the write was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return 0;
        }
    }
}